

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_exp_mod(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *E,mbedtls_mpi *N,
                       mbedtls_mpi *prec_RR)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  mbedtls_mpi_uint mm;
  ulong uVar8;
  long lVar9;
  short *X_00;
  ulong idx;
  ulong uVar10;
  bool bVar11;
  undefined1 local_c0 [8];
  mbedtls_mpi WW;
  mbedtls_mpi Apos;
  undefined1 auStack_88 [8];
  mbedtls_mpi W [2];
  mbedtls_mpi RR;
  mbedtls_mpi T;
  
  iVar6 = mbedtls_mpi_cmp_int(N,0);
  if (iVar6 < 1) {
    return -4;
  }
  if ((*N->p & 1) == 0) {
    return -4;
  }
  iVar6 = mbedtls_mpi_cmp_int(E,0);
  if (iVar6 < 0) {
    return -4;
  }
  sVar7 = mbedtls_mpi_bitlen(E);
  if (0x100 < sVar7) {
    return -4;
  }
  sVar7 = mbedtls_mpi_bitlen(N);
  if (0x100 < sVar7) {
    return -4;
  }
  mm = mbedtls_mpi_core_montmul_init(N->p);
  WW.p._0_4_ = 1;
  RR.p = (mbedtls_mpi_uint *)CONCAT44(RR.p._4_4_,1);
  W[1].s = 0;
  W[1].n = 0;
  W[1]._12_4_ = 0;
  RR.s = 0;
  RR.n = 0;
  RR._12_4_ = 0;
  WW.s = 0;
  WW.n = 0;
  WW._12_4_ = 0;
  local_c0 = (undefined1  [8])0x0;
  auStack_88 = (undefined1  [8])0x0;
  W[0].p = (mbedtls_mpi_uint *)0x0;
  W[0].s = 0;
  W[0].n = 0;
  W[0]._12_4_ = 0;
  W[1].p = (mbedtls_mpi_uint *)0x0;
  mbedtls_mpi_bitlen(E);
  W[0].p = (mbedtls_mpi_uint *)CONCAT44(W[0].p._4_4_,1);
  auStack_88 = (undefined1  [8])0x0;
  sVar7 = (ulong)N->n + 1;
  iVar6 = mbedtls_mpi_grow((mbedtls_mpi *)auStack_88,sVar7);
  if (((iVar6 == 0) && (iVar6 = mbedtls_mpi_grow((mbedtls_mpi *)&W[0].s,sVar7), iVar6 == 0)) &&
     (iVar6 = mbedtls_mpi_grow((mbedtls_mpi *)&RR.s,(ulong)(uint)((int)sVar7 * 2)), iVar6 == 0)) {
    sVar1 = A->s;
    if (sVar1 == -1) {
      iVar6 = mbedtls_mpi_copy((mbedtls_mpi *)&WW.s,A);
      if (iVar6 != 0) goto LAB_001dd693;
      A = (mbedtls_mpi *)&WW.s;
    }
    if ((prec_RR == (mbedtls_mpi *)0x0) || (prec_RR->p == (mbedtls_mpi_uint *)0x0)) {
      iVar6 = mbedtls_mpi_lset((mbedtls_mpi *)&W[1].s,1);
      if ((iVar6 != 0) ||
         ((iVar6 = mbedtls_mpi_shift_l((mbedtls_mpi *)&W[1].s,(ulong)N->n << 7), iVar6 != 0 ||
          (iVar6 = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&W[1].s,(mbedtls_mpi *)&W[1].s,N), iVar6 != 0)
          ))) goto LAB_001dd693;
      if (prec_RR != (mbedtls_mpi *)0x0) {
        prec_RR->p = (mbedtls_mpi_uint *)W[1]._8_8_;
        *(mbedtls_mpi_uint **)&prec_RR->s = RR.p;
      }
    }
    else {
      W[1]._8_8_ = prec_RR->p;
      RR.p = *(mbedtls_mpi_uint **)&prec_RR->s;
    }
    X_00 = &W[0].s;
    iVar6 = mbedtls_mpi_cmp_mpi(A,N);
    if (iVar6 < 0) {
      iVar6 = mbedtls_mpi_copy((mbedtls_mpi *)X_00,A);
    }
    else {
      iVar6 = mbedtls_mpi_mod_mpi((mbedtls_mpi *)X_00,A,N);
      if (iVar6 != 0) goto LAB_001dd693;
      iVar6 = mbedtls_mpi_grow((mbedtls_mpi *)X_00,(ulong)N->n + 1);
    }
    if (iVar6 == 0) {
      mpi_montmul((mbedtls_mpi *)X_00,(mbedtls_mpi *)&W[1].s,N,mm,(mbedtls_mpi *)&RR.s);
      iVar6 = mbedtls_mpi_copy((mbedtls_mpi *)auStack_88,(mbedtls_mpi *)&W[1].s);
      if (iVar6 == 0) {
        mpi_montred((mbedtls_mpi *)auStack_88,N,mm,(mbedtls_mpi *)&RR.s);
        uVar8 = (ulong)E->n;
        uVar10 = 0;
        bVar3 = false;
        bVar2 = false;
LAB_001dd868:
        bVar5 = bVar2;
        if (uVar10 == 0) {
          if (uVar8 == 0) goto LAB_001dd98e;
          uVar8 = uVar8 - 1;
          uVar10 = 0x40;
        }
        uVar10 = uVar10 - 1;
        bVar11 = (E->p[uVar8] >> (uVar10 & 0x3f) & 1) != 0;
        idx = (ulong)bVar11;
        bVar2 = bVar3 || idx != 0;
        bVar4 = bVar3 || idx != 0;
        bVar3 = false;
        if (bVar4) {
          iVar6 = mpi_select((mbedtls_mpi *)local_c0,(mbedtls_mpi *)auStack_88,2,0);
          if (bVar5 != true || bVar11) {
            if (iVar6 != 0) goto LAB_001dd693;
            mpi_montmul((mbedtls_mpi *)auStack_88,(mbedtls_mpi *)local_c0,N,mm,(mbedtls_mpi *)&RR.s)
            ;
            iVar6 = mpi_select((mbedtls_mpi *)local_c0,(mbedtls_mpi *)auStack_88,2,idx);
            if (iVar6 != 0) goto LAB_001dd693;
            mpi_montmul((mbedtls_mpi *)auStack_88,(mbedtls_mpi *)local_c0,N,mm,(mbedtls_mpi *)&RR.s)
            ;
          }
          else {
            if (iVar6 != 0) goto LAB_001dd693;
            mpi_montmul((mbedtls_mpi *)auStack_88,(mbedtls_mpi *)local_c0,N,mm,(mbedtls_mpi *)&RR.s)
            ;
          }
          bVar3 = true;
        }
        goto LAB_001dd868;
      }
    }
  }
LAB_001dd693:
  for (lVar9 = 0x10; lVar9 != 0x20; lVar9 = lVar9 + 0x10) {
    mbedtls_mpi_free((mbedtls_mpi *)((long)W + lVar9 + -8));
  }
  mbedtls_mpi_free((mbedtls_mpi *)auStack_88);
  mbedtls_mpi_free((mbedtls_mpi *)&W[0].s);
  mbedtls_mpi_free((mbedtls_mpi *)&RR.s);
  mbedtls_mpi_free((mbedtls_mpi *)&WW.s);
  mbedtls_mpi_free((mbedtls_mpi *)local_c0);
  if ((prec_RR == (mbedtls_mpi *)0x0) || (prec_RR->p == (mbedtls_mpi_uint *)0x0)) {
    mbedtls_mpi_free((mbedtls_mpi *)&W[1].s);
  }
  return iVar6;
LAB_001dd98e:
  mpi_montred((mbedtls_mpi *)auStack_88,N,mm,(mbedtls_mpi *)&RR.s);
  if (((sVar1 == -1) && (E->n != 0)) && ((*E->p & 1) != 0)) {
    W[0].p = (mbedtls_mpi_uint *)CONCAT62(W[0].p._2_6_,0xffff);
    iVar6 = mbedtls_mpi_add_mpi((mbedtls_mpi *)auStack_88,N,(mbedtls_mpi *)auStack_88);
    if (iVar6 != 0) goto LAB_001dd693;
  }
  iVar6 = mbedtls_mpi_copy(X,(mbedtls_mpi *)auStack_88);
  goto LAB_001dd693;
}

Assistant:

int mbedtls_mpi_exp_mod(mbedtls_mpi *X, const mbedtls_mpi *A,
                        const mbedtls_mpi *E, const mbedtls_mpi *N,
                        mbedtls_mpi *prec_RR)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t window_bitsize;
    size_t i, j, nblimbs;
    size_t bufsize, nbits;
    size_t exponent_bits_in_window = 0;
    mbedtls_mpi_uint ei, mm, state;
    mbedtls_mpi RR, T, W[(size_t) 1 << MBEDTLS_MPI_WINDOW_SIZE], WW, Apos;
    int neg;

    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(A != NULL);
    MPI_VALIDATE_RET(E != NULL);
    MPI_VALIDATE_RET(N != NULL);

    if (mbedtls_mpi_cmp_int(N, 0) <= 0 || (N->p[0] & 1) == 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    if (mbedtls_mpi_cmp_int(E, 0) < 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    if (mbedtls_mpi_bitlen(E) > MBEDTLS_MPI_MAX_BITS ||
        mbedtls_mpi_bitlen(N) > MBEDTLS_MPI_MAX_BITS) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    /*
     * Init temps and window size
     */
    mpi_montg_init(&mm, N);
    mbedtls_mpi_init(&RR); mbedtls_mpi_init(&T);
    mbedtls_mpi_init(&Apos);
    mbedtls_mpi_init(&WW);
    memset(W, 0, sizeof(W));

    i = mbedtls_mpi_bitlen(E);

    window_bitsize = (i > 671) ? 6 : (i > 239) ? 5 :
                     (i >  79) ? 4 : (i >  23) ? 3 : 1;

#if (MBEDTLS_MPI_WINDOW_SIZE < 6)
    if (window_bitsize > MBEDTLS_MPI_WINDOW_SIZE) {
        window_bitsize = MBEDTLS_MPI_WINDOW_SIZE;
    }
#endif

    const size_t w_table_used_size = (size_t) 1 << window_bitsize;

    /*
     * This function is not constant-trace: its memory accesses depend on the
     * exponent value. To defend against timing attacks, callers (such as RSA
     * and DHM) should use exponent blinding. However this is not enough if the
     * adversary can find the exponent in a single trace, so this function
     * takes extra precautions against adversaries who can observe memory
     * access patterns.
     *
     * This function performs a series of multiplications by table elements and
     * squarings, and we want the prevent the adversary from finding out which
     * table element was used, and from distinguishing between multiplications
     * and squarings. Firstly, when multiplying by an element of the window
     * W[i], we do a constant-trace table lookup to obfuscate i. This leaves
     * squarings as having a different memory access patterns from other
     * multiplications. So secondly, we put the accumulator in the table as
     * well, and also do a constant-trace table lookup to multiply by the
     * accumulator which is W[x_index].
     *
     * This way, all multiplications take the form of a lookup-and-multiply.
     * The number of lookup-and-multiply operations inside each iteration of
     * the main loop still depends on the bits of the exponent, but since the
     * other operations in the loop don't have an easily recognizable memory
     * trace, an adversary is unlikely to be able to observe the exact
     * patterns.
     *
     * An adversary may still be able to recover the exponent if they can
     * observe both memory accesses and branches. However, branch prediction
     * exploitation typically requires many traces of execution over the same
     * data, which is defeated by randomized blinding.
     */
    const size_t x_index = 0;
    mbedtls_mpi_init(&W[x_index]);

    j = N->n + 1;
    /* All W[i] including the accumulator must have at least N->n limbs for
     * the mpi_montmul() and mpi_montred() calls later. Here we ensure that
     * W[1] and the accumulator W[x_index] are large enough. later we'll grow
     * other W[i] to the same length. They must not be shrunk midway through
     * this function!
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&W[x_index], j));
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&W[1],  j));
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&T, j * 2));

    /*
     * Compensate for negative A (and correct at the end)
     */
    neg = (A->s == -1);
    if (neg) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&Apos, A));
        Apos.s = 1;
        A = &Apos;
    }

    /*
     * If 1st call, pre-compute R^2 mod N
     */
    if (prec_RR == NULL || prec_RR->p == NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&RR, 1));
        MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(&RR, N->n * 2 * biL));
        MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&RR, &RR, N));

        if (prec_RR != NULL) {
            memcpy(prec_RR, &RR, sizeof(mbedtls_mpi));
        }
    } else {
        memcpy(&RR, prec_RR, sizeof(mbedtls_mpi));
    }

    /*
     * W[1] = A * R^2 * R^-1 mod N = A * R mod N
     */
    if (mbedtls_mpi_cmp_mpi(A, N) >= 0) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&W[1], A, N));
        /* This should be a no-op because W[1] is already that large before
         * mbedtls_mpi_mod_mpi(), but it's necessary to avoid an overflow
         * in mpi_montmul() below, so let's make sure. */
        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&W[1], N->n + 1));
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&W[1], A));
    }

    /* Note that this is safe because W[1] always has at least N->n limbs
     * (it grew above and was preserved by mbedtls_mpi_copy()). */
    mpi_montmul(&W[1], &RR, N, mm, &T);

    /*
     * W[x_index] = R^2 * R^-1 mod N = R mod N
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&W[x_index], &RR));
    mpi_montred(&W[x_index], N, mm, &T);


    if (window_bitsize > 1) {
        /*
         * W[i] = W[1] ^ i
         *
         * The first bit of the sliding window is always 1 and therefore we
         * only need to store the second half of the table.
         *
         * (There are two special elements in the table: W[0] for the
         * accumulator/result and W[1] for A in Montgomery form. Both of these
         * are already set at this point.)
         */
        j = w_table_used_size / 2;

        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&W[j], N->n + 1));
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&W[j], &W[1]));

        for (i = 0; i < window_bitsize - 1; i++) {
            mpi_montmul(&W[j], &W[j], N, mm, &T);
        }

        /*
         * W[i] = W[i - 1] * W[1]
         */
        for (i = j + 1; i < w_table_used_size; i++) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&W[i], N->n + 1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&W[i], &W[i - 1]));

            mpi_montmul(&W[i], &W[1], N, mm, &T);
        }
    }

    nblimbs = E->n;
    bufsize = 0;
    nbits   = 0;
    state   = 0;

    while (1) {
        if (bufsize == 0) {
            if (nblimbs == 0) {
                break;
            }

            nblimbs--;

            bufsize = sizeof(mbedtls_mpi_uint) << 3;
        }

        bufsize--;

        ei = (E->p[nblimbs] >> bufsize) & 1;

        /*
         * skip leading 0s
         */
        if (ei == 0 && state == 0) {
            continue;
        }

        if (ei == 0 && state == 1) {
            /*
             * out of window, square W[x_index]
             */
            MBEDTLS_MPI_CHK(mpi_select(&WW, W, w_table_used_size, x_index));
            mpi_montmul(&W[x_index], &WW, N, mm, &T);
            continue;
        }

        /*
         * add ei to current window
         */
        state = 2;

        nbits++;
        exponent_bits_in_window |= (ei << (window_bitsize - nbits));

        if (nbits == window_bitsize) {
            /*
             * W[x_index] = W[x_index]^window_bitsize R^-1 mod N
             */
            for (i = 0; i < window_bitsize; i++) {
                MBEDTLS_MPI_CHK(mpi_select(&WW, W, w_table_used_size,
                                           x_index));
                mpi_montmul(&W[x_index], &WW, N, mm, &T);
            }

            /*
             * W[x_index] = W[x_index] * W[exponent_bits_in_window] R^-1 mod N
             */
            MBEDTLS_MPI_CHK(mpi_select(&WW, W, w_table_used_size,
                                       exponent_bits_in_window));
            mpi_montmul(&W[x_index], &WW, N, mm, &T);

            state--;
            nbits = 0;
            exponent_bits_in_window = 0;
        }
    }

    /*
     * process the remaining bits
     */
    for (i = 0; i < nbits; i++) {
        MBEDTLS_MPI_CHK(mpi_select(&WW, W, w_table_used_size, x_index));
        mpi_montmul(&W[x_index], &WW, N, mm, &T);

        exponent_bits_in_window <<= 1;

        if ((exponent_bits_in_window & ((size_t) 1 << window_bitsize)) != 0) {
            MBEDTLS_MPI_CHK(mpi_select(&WW, W, w_table_used_size, 1));
            mpi_montmul(&W[x_index], &WW, N, mm, &T);
        }
    }

    /*
     * W[x_index] = A^E * R * R^-1 mod N = A^E mod N
     */
    mpi_montred(&W[x_index], N, mm, &T);

    if (neg && E->n != 0 && (E->p[0] & 1) != 0) {
        W[x_index].s = -1;
        MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&W[x_index], N, &W[x_index]));
    }

    /*
     * Load the result in the output variable.
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(X, &W[x_index]));

cleanup:

    /* The first bit of the sliding window is always 1 and therefore the first
     * half of the table was unused. */
    for (i = w_table_used_size/2; i < w_table_used_size; i++) {
        mbedtls_mpi_free(&W[i]);
    }

    mbedtls_mpi_free(&W[x_index]);
    mbedtls_mpi_free(&W[1]);
    mbedtls_mpi_free(&T);
    mbedtls_mpi_free(&Apos);
    mbedtls_mpi_free(&WW);

    if (prec_RR == NULL || prec_RR->p == NULL) {
        mbedtls_mpi_free(&RR);
    }

    return ret;
}